

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::Memory::Init(Memory *this,u64 dst_offset,DataSegment *src,u64 src_offset,u64 size)

{
  bool bVar1;
  Enum EVar2;
  
  bVar1 = IsValidAccess(this,dst_offset,0,size);
  EVar2 = Error;
  if (((bVar1) && (src_offset <= src->size_ - size && size <= src->size_)) &&
     (EVar2 = Ok, size != 0)) {
    memmove((this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + dst_offset,
            (src->desc_->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start + src_offset,size);
  }
  return (Result)EVar2;
}

Assistant:

Result Memory::Init(u64 dst_offset,
                    const DataSegment& src,
                    u64 src_offset,
                    u64 size) {
  if (IsValidAccess(dst_offset, 0, size) &&
      src.IsValidRange(src_offset, size)) {
    std::copy(src.desc().data.begin() + src_offset,
              src.desc().data.begin() + src_offset + size,
#if WABT_BIG_ENDIAN
              data_.rbegin() + dst_offset);
#else
              data_.begin() + dst_offset);
#endif
    return Result::Ok;
  }
  return Result::Error;
}